

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::clear
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this)

{
  vector3_base<int> *pvVar1;
  vector3_base<int> *in_RDI;
  int in_stack_00000024;
  
  allocator_default<vector3_base<int>_>::free_array(in_RDI);
  (in_RDI->field_2).z = 1;
  pvVar1 = allocator_default<vector3_base<int>_>::alloc_array(in_stack_00000024);
  *(vector3_base<int> **)in_RDI = pvVar1;
  in_RDI[1].field_0.x = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}